

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::ServiceOptions::_InternalParse(ServiceOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  bool bVar5;
  byte *pbVar6;
  UninterpretedOption *obj;
  MessageLite *msg;
  uint uVar7;
  ulong uVar8;
  uint32_t res;
  uint uVar9;
  uint uVar10;
  UnknownFieldSet *unknown;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  byte *local_48;
  InternalMetadata *local_40;
  ExtensionSet *local_38;
  
  local_48 = (byte *)ptr;
  bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  uVar10 = 0;
  if (!bVar5) {
    local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_38 = &this->_extensions_;
    uVar10 = 0;
    do {
      bVar1 = *local_48;
      pVar11.second._0_1_ = bVar1;
      pVar11.first = (char *)(local_48 + 1);
      pVar11._9_7_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = local_48[1];
        res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar11 = internal::ReadTagFallback((char *)local_48,res);
        }
        else {
          pVar11.second = res;
          pVar11.first = (char *)(local_48 + 2);
          pVar11._12_4_ = 0;
        }
      }
      local_48 = (byte *)pVar11.first;
      uVar9 = pVar11.second;
      uVar7 = (uint)(pVar11._8_8_ >> 3) & 0x1fffffff;
      if (uVar7 == 999) {
        if ((char)pVar11.second != ':') goto LAB_0037ade0;
        local_48 = local_48 + -2;
        do {
          local_48 = local_48 + 2;
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_0037ada0:
            obj = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) goto LAB_0037ada0;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (MessageLite *)pRVar4->elements[iVar3];
          }
          local_48 = (byte *)internal::ParseContext::ParseMessage(ctx,msg,(char *)local_48);
          if (local_48 == (byte *)0x0) goto LAB_0037aea9;
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_48 == 0x3eba));
      }
      else {
        if ((uVar7 != 0x21) || ((char)pVar11.second != '\b')) {
LAB_0037ade0:
          if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
            if (local_48 != (byte *)0x0) {
              (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
              break;
            }
          }
          else {
            uVar8 = pVar11._8_8_ & 0xffffffff;
            if (uVar9 < 8000) {
              if ((local_40->ptr_ & 1U) == 0) {
                unknown = internal::InternalMetadata::
                          mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
              }
              else {
                unknown = (UnknownFieldSet *)((local_40->ptr_ & 0xfffffffffffffffcU) + 8);
              }
              local_48 = (byte *)internal::UnknownFieldParse(uVar8,unknown,(char *)local_48,ctx);
            }
            else {
              local_48 = (byte *)internal::ExtensionSet::ParseField
                                           (local_38,uVar8,(char *)local_48,
                                            (Message *)_ServiceOptions_default_instance_,local_40,
                                            ctx);
            }
LAB_0037ae4a:
            if (local_48 != (byte *)0x0) goto LAB_0037ae4f;
          }
LAB_0037aea9:
          local_48 = (byte *)0x0;
          break;
        }
        uVar8 = (ulong)(char)*local_48;
        pbVar6 = local_48 + 1;
        if ((long)uVar8 < 0) {
          uVar10 = ((uint)*pbVar6 * 0x80 + (uint)*local_48) - 0x80;
          if ((char)*pbVar6 < '\0') {
            pVar12 = internal::VarintParseSlow64((char *)local_48,uVar10);
            local_48 = (byte *)pVar12.first;
            this->deprecated_ = pVar12.second != 0;
            uVar10 = 1;
            goto LAB_0037ae4a;
          }
          uVar8 = (ulong)uVar10;
          pbVar6 = local_48 + 2;
        }
        this->deprecated_ = uVar8 != 0;
        uVar10 = 1;
        local_48 = pbVar6;
      }
LAB_0037ae4f:
      bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar5);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
  return (char *)local_48;
}

Assistant:

const char* ServiceOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    if ((8000u <= tag)) {
      ptr = _extensions_.ParseField(tag, ptr, internal_default_instance(), &_internal_metadata_, ctx);
      CHK_(ptr != nullptr);
      continue;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}